

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

string * __thiscall
booster::locale::gnu_gettext::mo_message<char>::convert_encoding_name
          (mo_message<char> *this,string *in)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RDX;
  string *in_RDI;
  char c;
  uint i;
  string *result;
  char local_21;
  uint local_20;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = 0;
  do {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= local_20) {
      return in_RDI;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDX);
    local_21 = *pcVar2;
    if ((local_21 < 'A') || ('Z' < local_21)) {
      if ((('`' < local_21) && (local_21 < '{')) || (('/' < local_21 && (local_21 < ':'))))
      goto LAB_002461cb;
    }
    else {
      local_21 = local_21 + ' ';
LAB_002461cb:
      std::__cxx11::string::operator+=((string *)in_RDI,local_21);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::string convert_encoding_name(std::string const &in)
                {
                    std::string result;
                    for(unsigned i=0;i<in.size();i++) {
                        char c=in[i];
                        if('A' <= c && c<='Z')
                            c=c-'A' + 'a';
                        else if(('a' <= c && c<='z') || ('0' <= c && c<='9'))
                            ;
                        else
                            continue;
                        result+=c;
                    }
                    return result;
                }